

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O0

void __thiscall
avro::concepts::SingleAttribute<avro::Name>::SingleAttribute
          (SingleAttribute<avro::Name> *this,Name *a)

{
  Name *in_RDI;
  Name *unaff_retaddr;
  
  Name::Name(unaff_retaddr,in_RDI);
  return;
}

Assistant:

SingleAttribute(const Attribute& a) : attr_(a) { }